

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_e2963::TokenPoolTest::TearDown(TokenPoolTest *this)

{
  TokenPoolTest *this_local;
  
  if ((this->tokens_ != (TokenPool *)0x0) && (this->tokens_ != (TokenPool *)0x0)) {
    (*this->tokens_->_vptr_TokenPool[1])();
  }
  close(this->fds_[0]);
  close(this->fds_[1]);
  unsetenv("MAKEFLAGS");
  return;
}

Assistant:

virtual void TearDown() {
    if (tokens_)
      delete tokens_;
#ifdef _WIN32
    CloseHandle(semaphore_);
#else
    close(fds_[0]);
    close(fds_[1]);
#endif
    ENVIRONMENT_CLEAR();
  }